

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O2

void __thiscall vera::Vbo::~Vbo(Vbo *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  this->_vptr_Vbo = (_func_int **)&PTR__Vbo_003de0d8;
  pcVar1 = (this->m_vertexData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertexData).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_vertexData).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  puVar2 = (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (this->m_vertexLayout != (VertexLayout *)0x0) {
    (*this->m_vertexLayout->_vptr_VertexLayout[1])();
  }
  glDeleteBuffers(1,&this->m_glVertexBuffer);
  glDeleteBuffers(1,&this->m_glIndexBuffer);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&(this->m_vertexData).super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  return;
}

Assistant:

Vbo::~Vbo() {
    m_vertexData.clear();
    m_indices.clear();

    if (m_vertexLayout != NULL)
        delete m_vertexLayout;

    glDeleteBuffers(1, &m_glVertexBuffer);
    glDeleteBuffers(1, &m_glIndexBuffer);
}